

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

ON__UINT32 __thiscall ON_Buffer::CRC32(ON_Buffer *this,ON__UINT32 current_remainder)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ulong uVar3;
  char *pcVar4;
  ON_BUFFER_SEGMENT *pOVar5;
  int iVar6;
  size_t count;
  ulong uVar7;
  ulong local_38;
  
  if (this->m_first_segment != (ON_BUFFER_SEGMENT *)0x0) {
    local_38 = 0;
    pOVar1 = this->m_first_segment;
    pOVar5 = (ON_BUFFER_SEGMENT *)0x0;
    do {
      pOVar2 = pOVar1;
      uVar3 = pOVar2->m_segment_position0;
      if (pOVar2->m_segment_position1 < uVar3) {
        iVar6 = 0x366;
        pcVar4 = "corrupt buffer - segment\'s position values are invalid.";
LAB_0045aedf:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                   ,iVar6,"",pcVar4);
      }
      else {
        if (pOVar5 == (ON_BUFFER_SEGMENT *)0x0) {
          if (uVar3 != 0) {
            iVar6 = 0x373;
            pcVar4 = "corrupt buffer - first segment has non-zero value for position0.";
            goto LAB_0045ae58;
          }
        }
        else if (pOVar5->m_segment_position1 != uVar3) {
          iVar6 = 0x37e;
          pcVar4 = "corrupt buffer - previous segment\'s position1 !- segment\'s position0.";
LAB_0045ae58:
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,iVar6,"",pcVar4);
        }
        count = pOVar2->m_segment_position1 - pOVar2->m_segment_position0;
        if (count == 0) {
          iVar6 = 0x387;
          pcVar4 = "corrupt buffer - empty segment buffer.";
          goto LAB_0045aedf;
        }
        uVar3 = this->m_buffer_size;
        uVar7 = count + local_38;
        if (uVar3 < count + local_38) {
          if ((pOVar2 != this->m_last_segment) ||
             (pOVar2->m_next_segment != (ON_BUFFER_SEGMENT *)0x0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                       ,0x391,"","corrupt buffer - segments contain more bytes than m_buffer_size.")
            ;
            uVar3 = this->m_buffer_size;
          }
          count = uVar3 - local_38;
          uVar7 = uVar3;
        }
        current_remainder = ON_CRC32(current_remainder,count,pOVar2->m_segment_buffer);
        local_38 = uVar7;
        if (this->m_buffer_size <= uVar7) {
          if (((pOVar2 == this->m_last_segment) && (uVar7 <= this->m_buffer_size)) &&
             (pOVar2->m_next_segment == (ON_BUFFER_SEGMENT *)0x0)) {
            return current_remainder;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x39e,"","corrupt buffer - list of segments is too long.");
          return current_remainder;
        }
      }
      pOVar1 = pOVar2->m_next_segment;
      pOVar5 = pOVar2;
    } while (pOVar2->m_next_segment != (ON_BUFFER_SEGMENT *)0x0);
  }
  return current_remainder;
}

Assistant:

ON__UINT32 ON_Buffer::CRC32( ON__UINT32 current_remainder ) const
{
  ON__UINT64 size, seg_size;
  const struct ON_BUFFER_SEGMENT* prev_seg;
  const struct ON_BUFFER_SEGMENT* seg;
  const struct ON_BUFFER_SEGMENT* seg0 = 0;

  size = 0;
  for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
  {
    // prev_seg is set this way so that the error handling
    // code can use continue statements for non-fatal errors.
    prev_seg = seg0;
    seg0 = seg;

    if ( seg->m_segment_position0 > seg->m_segment_position1 )
    {
      // This is really bad!  If you can determine how the corruption occurs,
      // please make a bug report and tell Dale Lear as soon as possible.
      ON_ERROR("corrupt buffer - segment's position values are invalid.");
      continue;
    }

    if ( 0 == prev_seg )
    {
      if ( 0 != seg->m_segment_position0 )
      {
        // The first segment should have seg->m_segment_position0 = 0.
        // We'll keep going after the call to ON_ERROR.
        //
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - first segment has non-zero value for position0.");
      }
    }
    else if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
    {
      // Every segment after the first should have 
      // seg->m_segment_position0 = previous_segment->m_segment_position1.
      // We'll keep going after the call to ON_ERROR.
      //
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - previous segment's position1 !- segment's position0.");
    }

    seg_size = seg->m_segment_position1 - seg->m_segment_position0;

    if ( 0 == seg_size )
    {
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - empty segment buffer.");
      continue;
    }
    
    if ( seg_size + size > m_buffer_size )
    {
      if ( seg != m_last_segment || seg->m_next_segment )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - segments contain more bytes than m_buffer_size.");
      }
      seg_size = m_buffer_size - size;
    }

    current_remainder = ON_CRC32(current_remainder,(size_t)seg_size,seg->m_segment_buffer);
    size += seg_size;
    if ( size >= m_buffer_size )
    {
      if ( seg != m_last_segment || 0 != seg->m_next_segment || size > m_buffer_size )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - list of segments is too long.");
      }
      break;
    }
  }

  return current_remainder;
}